

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service.c
# Opt level: O2

void fnode_service_update(fnode_service_t *svc)

{
  _Bool _Var1;
  fnode_service_state_t fVar2;
  size_t sVar3;
  ulong uVar4;
  size_t rs_num;
  undefined4 uStack_38;
  fnet_socket_t es;
  fnet_socket_t rs;
  size_t local_28;
  
  if (svc != (fnode_service_t *)0x0) {
    fVar2 = svc->state;
    if (fVar2 == FSVC_NOTIFY_STATUS) {
      sVar3 = fnode_service_time();
      fVar2 = FSVC_PROCESS_COMMANDS;
      if ((ulong)svc->keepalive <= sVar3 - svc->last_cmd_time) {
        rs_num._0_4_ = 0x474e4950;
        rs_num._4_4_ = (undefined4)*(undefined8 *)svc->sn;
        uStack_38 = (undefined4)((ulong)*(undefined8 *)svc->sn >> 0x20);
        fnet_socket_sendto(svc->socket,(char *)&rs_num,0xc,&svc->server);
        svc->last_cmd_time = sVar3;
      }
    }
    else if (fVar2 == FSVC_PROCESS_COMMANDS) {
      rs_num._0_4_ = 0;
      rs_num._4_4_ = 0;
      local_28 = 0;
      sVar3 = fnode_service_time();
      uVar4 = sVar3 - svc->last_cmd_time;
      sVar3 = svc->keepalive - uVar4;
      if (svc->keepalive < uVar4 || sVar3 == 0) {
        sVar3 = 1;
      }
      _Var1 = fnet_socket_select(&svc->socket,1,&rs,&rs_num,&es,&local_28,sVar3);
      if ((_Var1) && (CONCAT44(rs_num._4_4_,(undefined4)rs_num) != 0)) {
        fnode_service_recv_cmd(svc);
      }
      fVar2 = FSVC_NOTIFY_STATUS;
    }
    else {
      if (fVar2 != FSVC_INIT) {
        return;
      }
      fVar2 = fnode_service_init_handler(svc);
    }
    svc->state = fVar2;
  }
  return;
}

Assistant:

void fnode_service_update(fnode_service_t *svc)
{
    if (!svc)
        return;

    switch(svc->state)
    {
        case FSVC_INIT:
        {
            svc->state = fnode_service_init_handler(svc);
            break;
        }

        case FSVC_NOTIFY_STATUS:
        {
            svc->state = fnode_service_notify_status(svc);
            break;
        }

        case FSVC_PROCESS_COMMANDS:
        {
            svc->state = fnode_service_process_commands(svc);
            break;
        }
    }
}